

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::flush
          (ansicolor_sink<spdlog::details::console_mutex> *this)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  fflush(*(FILE **)((long)&in_RDI[0xb].super___mutex_base._M_mutex + 8));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x25772f);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::flush()
{
    std::lock_guard<mutex_t> lock(mutex_);
    fflush(target_file_);
}